

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

bool __thiscall
soplex::SPxBoundFlippingRT<double>::getData
          (SPxBoundFlippingRT<double> *this,double *val,int *leaveIdx,int idx,double stab,
          double degeneps,double *upd,double *vec,double *low,double *upp,BreakpointSource src,
          double max)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  Status SVar3;
  double *pdVar4;
  double dVar5;
  
  dVar1 = upd[idx];
  if (stab <= ABS(dVar1)) {
    pdVar4 = low;
    if (0.0 < dVar1 * max) {
      pdVar4 = upp;
    }
    *leaveIdx = idx;
    dVar5 = pdVar4[idx];
    *val = dVar5;
    dVar5 = (dVar5 - vec[idx]) / dVar1;
    *val = dVar5;
    if ((upp[idx] != low[idx]) || (NAN(upp[idx]) || NAN(low[idx]))) {
      if (((0.0 < max) && (dVar5 < -degeneps)) || ((max < 0.0 && (degeneps < dVar5)))) {
        *val = 0.0;
        pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        SVar3 = SPxBasisBase<double>::dualStatus
                          (&pSVar2->super_SPxBasisBase<double>,
                           (pSVar2->super_SPxBasisBase<double>).theBaseId.data + idx);
        if (SVar3 != D_ON_BOTH) {
          pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
          if (dVar1 * max <= 0.0) {
            SPxSolverBase<double>::shiftLBbound(pSVar2,idx,vec[idx]);
          }
          else {
            SPxSolverBase<double>::shiftUBbound(pSVar2,idx,vec[idx]);
          }
        }
      }
    }
    else {
      *val = 0.0;
      SPxSolverBase<double>::shiftLBbound
                ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver,idx,vec[idx]
                );
      SPxSolverBase<double>::shiftUBbound
                ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver,idx,vec[idx]
                );
    }
  }
  return stab <= ABS(dVar1);
}

Assistant:

bool SPxBoundFlippingRT<R>::getData(
   R&                 val,
   int&                  leaveIdx,
   int                   idx,
   R                  stab,
   R                  degeneps,
   const R*           upd,
   const R*           vec,
   const R*           low,
   const R*           upp,
   BreakpointSource      src,
   R                  max
)
{
   assert(src == FVEC);

   R x = upd[idx];

   // skip breakpoint if it is too small
   if(spxAbs(x) < stab)
   {
      return false;
   }

   leaveIdx = idx;
   val = (max * x > 0) ? upp[idx] : low[idx];
   val = (val - vec[idx]) / x;

   if(upp[idx] == low[idx])
   {
      val = 0.0;
      this->thesolver->shiftLBbound(idx, vec[idx]);
      this->thesolver->shiftUBbound(idx, vec[idx]);
   }
   else if((max > 0 && val < -degeneps) || (max < 0 && val > degeneps))
   {
      val = 0.0;

      if(this->thesolver->dualStatus(this->thesolver->baseId(idx)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(max * x > 0)
            this->thesolver->shiftUBbound(idx, vec[idx]);
         else
            this->thesolver->shiftLBbound(idx, vec[idx]);
      }
   }

   return true;
}